

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int al_ustr_ncompare(ALLEGRO_USTR *us1,ALLEGRO_USTR *us2,int n)

{
  int in_EDX;
  int32_t c2;
  int32_t c1;
  int pos2;
  int pos1;
  undefined4 in_stack_ffffffffffffffd0;
  int32_t in_stack_ffffffffffffffd4;
  int32_t in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  int local_1c;
  
  uVar1 = 0;
  local_1c = in_EDX;
  if (0 < in_EDX) {
    do {
      in_stack_ffffffffffffffd8 =
           al_ustr_get_next((ALLEGRO_USTR *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                            (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      in_stack_ffffffffffffffd4 =
           al_ustr_get_next((ALLEGRO_USTR *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                            (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if (in_stack_ffffffffffffffd8 != in_stack_ffffffffffffffd4) {
        return in_stack_ffffffffffffffd8 - in_stack_ffffffffffffffd4;
      }
    } while ((in_stack_ffffffffffffffd8 != -1) && (local_1c = local_1c + -1, 0 < local_1c));
  }
  return 0;
}

Assistant:

int al_ustr_ncompare(const ALLEGRO_USTR *us1, const ALLEGRO_USTR *us2, int n)
{
   int pos1 = 0;
   int pos2 = 0;

   if (n <= 0)
      return 0;

   for (;;) {
      int32_t c1 = al_ustr_get_next(us1, &pos1);
      int32_t c2 = al_ustr_get_next(us2, &pos2);

      if (c1 != c2) {
         /* This happens to work even when one of c1 or c2 is -1. */
         return c1 - c2;
      }

      if ((c1 == -1) || (--n <= 0))
         return 0;
   }
}